

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  bool local_21;
  iterator *this_local;
  
  this->m_pos = this->m_len + this->m_pos;
  uVar1 = this->m_pos;
  line_abi_cxx11_(this);
  uVar3 = ::std::__cxx11::string::size();
  if (uVar1 < uVar3) {
    psVar4 = line_abi_cxx11_(this);
    pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
    if (*pcVar5 == '\n') {
      this->m_pos = this->m_pos + 1;
      goto LAB_0016a0c1;
    }
  }
  while( true ) {
    uVar1 = this->m_pos;
    line_abi_cxx11_(this);
    uVar3 = ::std::__cxx11::string::size();
    local_21 = false;
    if (uVar1 < uVar3) {
      psVar4 = line_abi_cxx11_(this);
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
      local_21 = isWhitespace(*pcVar5);
    }
    if (local_21 == false) break;
    this->m_pos = this->m_pos + 1;
  }
LAB_0016a0c1:
  sVar2 = this->m_pos;
  line_abi_cxx11_(this);
  sVar6 = ::std::__cxx11::string::size();
  if (sVar2 == sVar6) {
    this->m_pos = 0;
    this->m_stringIndex = this->m_stringIndex + 1;
  }
  uVar1 = this->m_stringIndex;
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_column->m_strings);
  if (uVar1 < sVar7) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}